

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot_histogram_of_intervals_lengths.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  uint uVar1;
  int iVar2;
  size_t sVar3;
  ostream *poVar4;
  uint dimension;
  long lVar5;
  size_t where_to_cut;
  vector<unsigned_long,_std::allocator<unsigned_long>_> histogram;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> dominant_intervals;
  Persistence_intervals p;
  ofstream out;
  stringstream gnuplot_script;
  long *local_430;
  long local_420 [2];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_410;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_3f8;
  Persistence_intervals local_3e0;
  long local_3b8;
  filebuf local_3b0 [240];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "This program computes a histogram of barcode\'s length. A number of bins in the histogram is a "
             ,0x5e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"parameter of this program. \n",0x1c);
  if (argc - 5U < 0xfffffffe) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,
               "To run this program, please provide the name of a file with persistence diagram and number of "
               ,0x5e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,
               "dominant intervals you would like to get. Set a negative number dominant intervals value "
               ,0x59);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"If your file contains only birth-death pairs.\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,
               "The third parameter is the dimension of the persistence that is to be used. If your "
               ,0x54);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,
               "file contains only birth-death pairs, you can skip this parameter\n",0x42);
    iVar2 = 1;
  }
  else {
    uVar1 = atoi(argv[2]);
    dimension = 0xffffffff;
    if (-1 < (int)uVar1) {
      dimension = uVar1;
    }
    where_to_cut = 0xffffffffffffffff;
    if (argc == 4) {
      iVar2 = atoi(argv[3]);
      where_to_cut = (size_t)iVar2;
    }
    Gudhi::Persistence_representations::Persistence_intervals::Persistence_intervals
              (&local_3e0,argv[1],dimension);
    Gudhi::Persistence_representations::Persistence_intervals::dominant_intervals
              (&local_3f8,&local_3e0,where_to_cut);
    Gudhi::Persistence_representations::Persistence_intervals::histogram_of_lengths
              (&local_410,&local_3e0,10);
    std::__cxx11::stringstream::stringstream(local_1b8);
    __s = argv[1];
    if (__s == (char *)0x0) {
      std::ios::clear((int)(ostream *)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
    }
    else {
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_GnuplotScript",0xe);
    std::ofstream::ofstream(&local_3b8);
    std::__cxx11::stringbuf::str();
    std::ofstream::open((char *)&local_3b8,(_Ios_Openmode)local_430);
    if (local_430 != local_420) {
      operator_delete(local_430,local_420[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_3b8,"set style data histogram",0x18);
    std::ios::widen((char)(ostream *)&local_3b8 + (char)*(undefined8 *)(local_3b8 + -0x18));
    std::ostream::put((char)&local_3b8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_3b8,"set style histogram cluster gap 1",0x21);
    std::ios::widen((char)(ostream *)&local_3b8 + (char)*(undefined8 *)(local_3b8 + -0x18));
    std::ostream::put((char)&local_3b8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_3b8,"set style fill solid border -1",0x1e);
    std::ios::widen((char)(ostream *)&local_3b8 + (char)*(undefined8 *)(local_3b8 + -0x18));
    std::ostream::put((char)&local_3b8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_3b8,"plot \'-\' notitle",0x10);
    std::ios::widen((char)(ostream *)&local_3b8 + (char)*(undefined8 *)(local_3b8 + -0x18));
    std::ostream::put((char)&local_3b8);
    std::ostream::flush();
    if (local_410.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_410.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar5 = 0;
      do {
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&local_3b8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        lVar5 = lVar5 + 1;
      } while (lVar5 != (long)local_410.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_410.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3);
    }
    std::ios::widen((char)&local_3b8 + (char)*(undefined8 *)(local_3b8 + -0x18));
    std::ostream::put((char)&local_3b8);
    std::ostream::flush();
    std::ofstream::close();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,
               "To visualize, install gnuplot and type the command: gnuplot -persist -e \"load \'",
               0x4f);
    std::__cxx11::stringbuf::str();
    if (local_430 == (long *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::clog + -0x18) + 0x10a028);
    }
    else {
      sVar3 = strlen((char *)local_430);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::clog,(char *)local_430,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"\'\"",2);
    std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    if (local_430 != local_420) {
      operator_delete(local_430,local_420[0] + 1);
    }
    local_3b8 = _VTT;
    *(undefined8 *)(local_3b0 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
    std::filebuf::~filebuf(local_3b0);
    std::ios_base::~ios_base(local_2c0);
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    if (local_410.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_410.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_410.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_410.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_3f8.
        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3f8.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_3f8.
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3f8.
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_3e0.intervals.
        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3e0.intervals.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_3e0.intervals.
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3e0.intervals.
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv) {
  std::clog << "This program computes a histogram of barcode's length. A number of bins in the histogram is a "
            << "parameter of this program. \n";
  if ((argc != 3) && (argc != 4)) {
    std::clog << "To run this program, please provide the name of a file with persistence diagram and number of "
              << "dominant intervals you would like to get. Set a negative number dominant intervals value "
              << "If your file contains only birth-death pairs.\n"
              << "The third parameter is the dimension of the persistence that is to be used. If your "
              << "file contains only birth-death pairs, you can skip this parameter\n";
    return 1;
  }

  unsigned dominant_interval_number = std::numeric_limits<unsigned>::max();
  int nbr = atoi(argv[2]);
  if (nbr >= 0) {
    dominant_interval_number = static_cast<unsigned>(nbr);
  }

  int persistence_dimension = -1;
  if (argc == 4) {
    persistence_dimension = atoi(argv[3]);
  }

  Persistence_intervals p(argv[1], dominant_interval_number);
  std::vector<std::pair<double, double> > dominant_intervals = p.dominant_intervals(persistence_dimension);
  std::vector<size_t> histogram = p.histogram_of_lengths(10);

  std::stringstream gnuplot_script;
  gnuplot_script << argv[1] << "_GnuplotScript";
  std::ofstream out;
  out.open(gnuplot_script.str().c_str());

  out << "set style data histogram" << std::endl;
  out << "set style histogram cluster gap 1" << std::endl;
  out << "set style fill solid border -1" << std::endl;
  out << "plot '-' notitle" << std::endl;
  for (size_t i = 0; i != histogram.size(); ++i) {
    out << histogram[i] << std::endl;
  }
  out << std::endl;
  out.close();

  std::clog << "To visualize, install gnuplot and type the command: gnuplot -persist -e \"load \'"
            << gnuplot_script.str().c_str() << "\'\"" << std::endl;
  return 0;
}